

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  byte bVar2;
  stbi_uc asVar3 [4];
  stbi_uc sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  stbi_uc *psVar11;
  int *piVar12;
  char *pcVar13;
  stbi_uc *psVar14;
  byte *pbVar15;
  uchar *puVar16;
  int iVar17;
  int *piVar18;
  undefined4 uVar19;
  undefined7 uVar20;
  char cVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong __n;
  long in_FS_OFFSET;
  bool bVar25;
  bool bVar26;
  uchar raw_data [4];
  stbi_uc local_88 [4];
  uint local_84;
  uint *local_80;
  uint local_78;
  uint local_74;
  ulong local_70;
  int *local_68;
  undefined4 local_5c;
  uint local_58;
  uint local_54;
  stbi_uc *local_50;
  undefined4 local_44;
  ulong local_40;
  stbi_uc *local_38;
  
  puVar16 = (uchar *)(ulong)(uint)req_comp;
  pbVar15 = s->img_buffer;
  if (pbVar15 < s->img_buffer_end) {
LAB_00125f0f:
    s->img_buffer = pbVar15 + 1;
    local_40 = CONCAT44(local_40._4_4_,(uint)*pbVar15);
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      pbVar15 = s->img_buffer;
      goto LAB_00125f0f;
    }
    local_40 = local_40 & 0xffffffff00000000;
  }
  psVar11 = s->img_buffer;
  local_80 = (uint *)comp;
  local_68 = x;
  if (psVar11 < s->img_buffer_end) {
LAB_00125fa9:
    s->img_buffer = psVar11 + 1;
    uVar23 = CONCAT71((int7)((ulong)x >> 8),*psVar11 != '\0');
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      psVar11 = s->img_buffer;
      goto LAB_00125fa9;
    }
    uVar23 = 0;
  }
  psVar11 = s->img_buffer;
  if (psVar11 < s->img_buffer_end) {
LAB_0012603e:
    s->img_buffer = psVar11 + 1;
    local_74 = (uint)CONCAT71((int7)((ulong)psVar11 >> 8),*psVar11);
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      psVar11 = s->img_buffer;
      goto LAB_0012603e;
    }
    local_74 = 0;
  }
  uVar6 = stbi__get16le(s);
  local_58 = stbi__get16le(s);
  pbVar15 = s->img_buffer;
  local_84 = uVar6;
  if (pbVar15 < s->img_buffer_end) {
LAB_001260e3:
    s->img_buffer = pbVar15 + 1;
    uVar6 = (uint)*pbVar15;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      pbVar15 = s->img_buffer;
      goto LAB_001260e3;
    }
    uVar6 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  iVar5 = stbi__get16le(s);
  uVar7 = stbi__get16le(s);
  psVar14 = s->img_buffer;
  local_54 = (uint)uVar23;
  psVar11 = (stbi_uc *)y;
  if (psVar14 < s->img_buffer_end) {
LAB_001261a6:
    s->img_buffer = psVar14 + 1;
    local_78 = (uint)CONCAT71((int7)((ulong)psVar14 >> 8),*psVar14);
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar8 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar8;
      }
      psVar14 = s->img_buffer;
      uVar23 = (ulong)local_54;
      goto LAB_001261a6;
    }
    local_78 = 0;
  }
  cVar21 = (char)uVar23;
  pbVar15 = s->img_buffer;
  if (pbVar15 < s->img_buffer_end) {
LAB_0012623f:
    s->img_buffer = pbVar15 + 1;
    bVar26 = (*pbVar15 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar8 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar8;
      }
      pbVar15 = s->img_buffer;
      cVar21 = (char)local_54;
      goto LAB_0012623f;
    }
    bVar26 = true;
  }
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  uVar20 = (undefined7)((ulong)psVar11 >> 8);
  if (cVar21 == '\0') {
    uVar6 = local_78 & 0xff;
    if ((local_78 & 0xff) < 0x10) {
      if ((local_78 & 0xff) != 8) {
        if (uVar6 == 0xf) goto LAB_001262d6;
        goto LAB_001262f7;
      }
LAB_001262ee:
      uVar6 = 1;
    }
    else if ((uVar6 == 0x20) || (uVar6 == 0x18)) {
      uVar6 = local_78 >> 3 & 0x1f;
    }
    else {
      if (uVar6 != 0x10) goto LAB_001262f7;
      uVar6 = (local_74 & 0xff) - 8;
      if ((byte)local_74 < 8) {
        uVar6 = local_74 & 0xff;
      }
      if (uVar6 != 3) goto LAB_001262d6;
      uVar6 = uVar6 == 3 ^ 3;
    }
LAB_001262f3:
    uVar19 = (undefined4)CONCAT71(uVar20,1);
    local_44 = 0;
  }
  else {
    if (uVar6 < 0x18) {
      if (uVar6 - 0xf < 2) {
LAB_001262d6:
        uVar6 = 3;
        local_44 = 1;
        uVar19 = 0;
        goto LAB_001262fb;
      }
      if (uVar6 == 8) goto LAB_001262ee;
    }
    else if ((uVar6 == 0x18) || (uVar6 == 0x20)) {
      uVar6 = uVar6 >> 3;
      goto LAB_001262f3;
    }
LAB_001262f7:
    uVar19 = (undefined4)CONCAT71(uVar20,1);
    local_44 = 0;
    uVar6 = 0;
  }
LAB_001262fb:
  if (uVar6 == 0) {
    pcVar13 = "bad format";
    goto LAB_001264ab;
  }
  *local_68 = iVar5;
  *y = uVar7;
  if (local_80 != (uint *)0x0) {
    *local_80 = uVar6;
  }
  iVar8 = stbi__mad3sizes_valid(iVar5,uVar7,uVar6,0);
  if (iVar8 == 0) {
    pcVar13 = "too large";
    goto LAB_001264ab;
  }
  local_70 = (ulong)uVar7;
  local_68 = (int *)stbi__malloc_mad3(iVar5,uVar7,uVar6,0);
  if (local_68 == (int *)0x0) {
LAB_001264a4:
    pcVar13 = "outofmem";
    goto LAB_001264ab;
  }
  local_80 = (uint *)CONCAT44(local_80._4_4_,uVar6);
  bVar25 = (byte)local_74 < 8;
  stbi__skip(s,(int)local_40);
  uVar6 = local_58;
  piVar12 = local_68;
  iVar8 = (uint)local_80;
  if ((cVar21 == '\0' && (char)local_44 == '\0') && bVar25) {
    if ((int)local_70 != 0) {
      iVar10 = (uint)local_80 * iVar5;
      iVar17 = 0;
      iVar8 = (int)local_70;
      do {
        iVar8 = iVar8 + -1;
        iVar9 = iVar17;
        if (bVar26) {
          iVar9 = iVar8;
        }
        stbi__getn(s,(stbi_uc *)((long)piVar12 + (long)(iVar9 * iVar10)),iVar10);
        iVar17 = iVar17 + 1;
      } while (iVar8 != 0);
    }
    goto LAB_00126917;
  }
  if (cVar21 == '\0') {
    local_50 = (stbi_uc *)0x0;
  }
  else {
    if (local_58 == 0) {
LAB_0012648c:
      free(piVar12);
      pcVar13 = "bad palette";
LAB_001264ab:
      *(char **)(in_FS_OFFSET + -8) = pcVar13;
      return (void *)0x0;
    }
    stbi__skip(s,local_84);
    piVar12 = (int *)stbi__malloc_mad2(uVar6,iVar8,0);
    if (piVar12 == (int *)0x0) {
      free(local_68);
      goto LAB_001264a4;
    }
    local_50 = (stbi_uc *)piVar12;
    if ((char)uVar19 == '\0') {
      if (iVar8 != 3) {
        __assert_fail("tga_comp == STBI_rgb",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/stb/stb_image.h"
                      ,0x1691,
                      "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                     );
      }
      lVar24 = 0;
      do {
        uVar7 = stbi__get16le(s);
        *(stbi_uc *)((long)piVar12 + lVar24) =
             (stbi_uc)((ulong)((uVar7 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
        *(stbi_uc *)((long)piVar12 + lVar24 + 1) =
             (stbi_uc)((ulong)((uVar7 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
        *(stbi_uc *)((long)piVar12 + lVar24 + 2) =
             (stbi_uc)((ulong)((uVar7 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
        lVar24 = lVar24 + 3;
      } while (uVar6 * 3 != (int)lVar24);
    }
    else {
      iVar8 = stbi__getn(s,(stbi_uc *)piVar12,iVar8 * uVar6);
      if (iVar8 == 0) {
        free(local_68);
        goto LAB_0012648c;
      }
    }
  }
  local_5c = uVar19;
  if ((int)local_70 * iVar5 != 0) {
    psVar11 = s->buffer_start;
    __n = (ulong)((uint)local_80 + ((uint)local_80 == 0));
    local_38 = s->buffer_start + 1;
    local_40 = (ulong)(uint)((int)local_70 * iVar5);
    uVar23 = 0;
    bVar2 = 0;
    local_84 = 0;
    iVar8 = 0;
    do {
      if ((byte)local_74 < 8) {
LAB_00126662:
        bVar25 = false;
      }
      else {
        if (iVar8 == 0) {
          pbVar15 = s->img_buffer;
          if (pbVar15 < s->img_buffer_end) {
LAB_00126643:
            s->img_buffer = pbVar15 + 1;
            local_84 = (uint)*pbVar15;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
              s->callback_already_read =
                   s->callback_already_read +
                   (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
              if (iVar8 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar11;
                s->img_buffer_end = local_38;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar11;
                s->img_buffer_end = psVar11 + iVar8;
              }
              pbVar15 = s->img_buffer;
              goto LAB_00126643;
            }
            local_84 = 0;
          }
          iVar8 = (local_84 & 0x7f) + 1;
          local_84 = local_84 >> 7;
          goto LAB_00126662;
        }
        bVar25 = (bool)(bVar2 & local_84 != 0);
        local_84 = (uint)(local_84 != 0);
      }
      uVar6 = local_58;
      if (!bVar25) {
        if ((char)local_54 == '\0') {
          if ((char)local_5c == '\0') {
            if ((uint)local_80 != 3) {
              __assert_fail("tga_comp == STBI_rgb",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/stb/stb_image.h"
                            ,0x16c2,
                            "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                           );
            }
            uVar6 = stbi__get16le(s);
            asVar3 = local_88;
            local_88[1] = (char)((ulong)((uVar6 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
            local_88[0] = (char)((ulong)((uVar6 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
            local_88[3] = asVar3[3];
            local_88[2] = (char)((ulong)((uVar6 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
          }
          else {
            uVar22 = 0;
            do {
              psVar14 = s->img_buffer;
              if (psVar14 < s->img_buffer_end) {
LAB_00126765:
                s->img_buffer = psVar14 + 1;
                sVar4 = *psVar14;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
                  s->callback_already_read =
                       s->callback_already_read +
                       (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                  if (iVar10 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar11;
                    s->img_buffer_end = local_38;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar11;
                    s->img_buffer_end = psVar11 + iVar10;
                  }
                  psVar14 = s->img_buffer;
                  goto LAB_00126765;
                }
                sVar4 = '\0';
              }
              local_88[uVar22] = sVar4;
              uVar22 = uVar22 + 1;
            } while (__n != uVar22);
          }
        }
        else {
          if ((char)local_78 == '\b') {
            pbVar15 = s->img_buffer;
            if (s->img_buffer_end <= pbVar15) {
              if (s->read_from_callbacks == 0) {
                uVar7 = 0;
                goto LAB_0012683d;
              }
              iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
              s->callback_already_read =
                   s->callback_already_read +
                   (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
              if (iVar10 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar11;
                s->img_buffer_end = local_38;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar11;
                s->img_buffer_end = psVar11 + iVar10;
              }
              pbVar15 = s->img_buffer;
            }
            s->img_buffer = pbVar15 + 1;
            uVar7 = (uint)*pbVar15;
          }
          else {
            uVar7 = stbi__get16le(s);
            uVar6 = local_58;
          }
LAB_0012683d:
          if (uVar6 <= uVar7) {
            uVar7 = 0;
          }
          memcpy(local_88,local_50 + uVar7 * (uint)local_80,__n);
        }
      }
      memcpy((stbi_uc *)((long)local_68 + (ulong)((uint)local_80 * (int)uVar23)),local_88,__n);
      iVar8 = iVar8 + -1;
      uVar23 = uVar23 + 1;
      bVar2 = 1;
    } while (uVar23 != local_40);
  }
  piVar12 = local_68;
  if (bVar26 && (int)local_70 != 0) {
    iVar8 = (uint)local_80 * iVar5;
    iVar10 = iVar8 * ((int)local_70 - 1U);
    uVar6 = 0;
    puVar16 = (uchar *)0x0;
    do {
      if (iVar8 != 0) {
        piVar18 = local_68;
        iVar17 = iVar8 + 1;
        do {
          sVar4 = *(stbi_uc *)((long)piVar18 + (ulong)uVar6);
          *(stbi_uc *)((long)piVar18 + (ulong)uVar6) = *(stbi_uc *)((long)piVar18 + (long)iVar10);
          *(stbi_uc *)((long)piVar18 + (long)iVar10) = sVar4;
          piVar18 = (int *)((long)piVar18 + 1);
          iVar17 = iVar17 + -1;
        } while (1 < iVar17);
      }
      uVar7 = (uint)puVar16;
      iVar10 = iVar10 - iVar8;
      uVar6 = uVar6 + iVar8;
      puVar16 = (uchar *)(ulong)(uVar7 + 1);
    } while (uVar7 != (int)local_70 - 1U >> 1);
  }
  if (local_50 != (stbi_uc *)0x0) {
    free(local_50);
  }
LAB_00126917:
  if (((char)local_44 == '\0' && 2 < (uint)local_80) && (iVar8 = (uint)local_70 * iVar5, iVar8 != 0)
     ) {
    puVar16 = (uchar *)((long)piVar12 + 2);
    do {
      uVar1 = puVar16[-2];
      puVar16[-2] = *puVar16;
      *puVar16 = uVar1;
      puVar16 = puVar16 + ((ulong)local_80 & 0xffffffff);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if ((uint)local_80 == 4) {
    return (uchar *)piVar12;
  }
  puVar16 = stbi__convert_format((uchar *)piVar12,(uint)local_80,iVar5,(uint)local_70,(uint)puVar16)
  ;
  return puVar16;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}